

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void __thiscall asl::String::split(String *this,Array<asl::String> *a)

{
  byte bVar1;
  int j;
  long lVar2;
  int i;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  String SStack_48;
  
  Array<asl::String>::clear(a);
  if (this->_size == 0) {
    paVar3 = &this->field_2;
  }
  else {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  i = 0;
  do {
    if (this->_len < i) {
      return;
    }
    lVar2 = (long)i;
    bVar1 = paVar3->_space[lVar2];
    j = i;
    if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
       ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      for (; j = j + 1, lVar2 < this->_len; lVar2 = lVar2 + 1) {
        bVar1 = paVar3->_space[lVar2 + 1];
        if ((((char)bVar1 < '!') && (bVar1 < 0x21)) &&
           ((0x100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) {
          substring(&SStack_48,this,i,j);
          Array<asl::String>::operator<<(a,&SStack_48);
          ~String(&SStack_48);
          i = j;
          break;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void String::split(Array<String>& a) const
{
	a.clear();
	const char* s = str();
	for(int i=0; i<=length(); i++)
	{
		if(myisspace(s[i]))
			continue;
		for(int j=i+1; j<length()+1; j++)
		{
			if(myisspace(s[j]) || s[j]=='\0')
			{
				a << substring(i, j);
				i=j;
				break;
			}
		}
	}
}